

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O1

int __thiscall
duckdb_apache::thrift::transport::TTransport::open(TTransport *this,char *__file,int __oflag,...)

{
  TException *this_00;
  string local_40;
  
  this_00 = (TException *)__cxa_allocate_exception(0x30,__file,___oflag);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot open base TTransport.","");
  TException::TException(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__TException_019d8818;
  *(undefined4 *)(this_00 + 1) = 1;
  __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

virtual void open() {
    throw TTransportException(TTransportException::NOT_OPEN, "Cannot open base TTransport.");
  }